

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

void __thiscall CPU::Z80::State::Registers::Registers(Registers *this)

{
  allocator<char> local_29;
  string local_28;
  
  (this->super_StructImpl<CPU::Z80::State::Registers>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__0058dcb0;
  if (Reflection::StructImpl<CPU::Z80::State::Registers>::contents__abi_cxx11_._M_h._M_element_count
      == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"a",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->a,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"flags",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->flags,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"bc",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->bc,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"de",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->de,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"hl",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->hl,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"af_dash",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->af_dash,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"bc_dash",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->bc_dash,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"de_dash",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->de_dash,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"hl_dash",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->hl_dash,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"ix",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->ix,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"iy",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->iy,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"ir",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->ir,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"program_counter",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->program_counter,&local_28)
    ;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"stack_pointer",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->stack_pointer,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"interrupt_mode",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<int>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->interrupt_mode,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"iff1",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<bool>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->iff1,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"iff2",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<bool>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->iff2,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"memptr",&local_29);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->memptr,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

State::Registers::Registers() {
	if(needs_declare()) {
		DeclareField(a);
		DeclareField(flags);
		DeclareField(bc);
		DeclareField(de);
		DeclareField(hl);
		DeclareField(af_dash);	// TODO: is there any disadvantage to declaring these for reflective
		DeclareField(bc_dash);	// purposes as AF', BC', etc?
		DeclareField(de_dash);
		DeclareField(hl_dash);
		DeclareField(ix);
		DeclareField(iy);
		DeclareField(ir);
		DeclareField(program_counter);
		DeclareField(stack_pointer);
		DeclareField(interrupt_mode);
		DeclareField(iff1);
		DeclareField(iff2);
		DeclareField(memptr);
	}
}